

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O1

int32_t __thiscall
icu_63::RuleBasedCollator::internalGetShortDefinitionString
          (RuleBasedCollator *this,char *locale,char *buffer,int32_t capacity,UErrorCode *errorCode)

{
  char *pcVar1;
  int32_t iVar2;
  UColAttributeValue UVar3;
  int32_t iVar4;
  CharString result;
  char subtag [100];
  char resultLocale [158];
  CharString local_178;
  char local_138 [112];
  char local_c8 [160];
  
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  if (buffer == (char *)0x0) {
    if (capacity != 0) goto LAB_0022e8a4;
  }
  else if (capacity < 0) {
LAB_0022e8a4:
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return 0;
  }
  if (locale == (char *)0x0) {
    if ((this->validLocale).fIsBogus == '\0') {
      pcVar1 = (this->validLocale).fullName;
      locale = "root";
      if (*pcVar1 != '\0') {
        locale = pcVar1;
      }
    }
    else {
      locale = (char *)0x0;
    }
  }
  iVar4 = 0;
  iVar2 = ucol_getFunctionalEquivalent_63(local_c8,0x9d,"collation",locale,(UBool *)0x0,errorCode);
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (iVar2 == 0) {
      builtin_strncpy(local_c8,"root",5);
    }
    else {
      local_c8[iVar2] = '\0';
    }
    MaybeStackArray<char,_40>::MaybeStackArray(&local_178.buffer);
    local_178.len = 0;
    *local_178.buffer.ptr = '\0';
    if ((this->explicitlySetAttributes & 2) != 0) {
      UVar3 = (*(this->super_Collator).super_UObject._vptr_UObject[0x18])(this,1,errorCode);
      anon_unknown_16::appendAttribute(&local_178,'A',UVar3,errorCode);
    }
    if ((this->explicitlySetAttributes & 4) != 0) {
      UVar3 = (*(this->super_Collator).super_UObject._vptr_UObject[0x18])(this,2,errorCode);
      anon_unknown_16::appendAttribute(&local_178,'C',UVar3,errorCode);
    }
    if ((this->explicitlySetAttributes & 0x80) != 0) {
      UVar3 = (*(this->super_Collator).super_UObject._vptr_UObject[0x18])(this,7,errorCode);
      anon_unknown_16::appendAttribute(&local_178,'D',UVar3,errorCode);
    }
    if ((this->explicitlySetAttributes & 8) != 0) {
      UVar3 = (*(this->super_Collator).super_UObject._vptr_UObject[0x18])(this,3,errorCode);
      anon_unknown_16::appendAttribute(&local_178,'E',UVar3,errorCode);
    }
    if ((this->explicitlySetAttributes & 1) != 0) {
      UVar3 = (*(this->super_Collator).super_UObject._vptr_UObject[0x18])(this,0,errorCode);
      anon_unknown_16::appendAttribute(&local_178,'F',UVar3,errorCode);
    }
    iVar2 = uloc_getKeywordValue_63(local_c8,"collation",local_138,100,errorCode);
    anon_unknown_16::appendSubtag(&local_178,'K',local_138,iVar2,errorCode);
    iVar2 = uloc_getLanguage_63(local_c8,local_138,100,errorCode);
    anon_unknown_16::appendSubtag(&local_178,'L',local_138,iVar2,errorCode);
    if ((this->explicitlySetAttributes & 0x10) != 0) {
      UVar3 = (*(this->super_Collator).super_UObject._vptr_UObject[0x18])(this,4,errorCode);
      anon_unknown_16::appendAttribute(&local_178,'N',UVar3,errorCode);
    }
    iVar2 = uloc_getCountry_63(local_c8,local_138,100,errorCode);
    anon_unknown_16::appendSubtag(&local_178,'R',local_138,iVar2,errorCode);
    if ((this->explicitlySetAttributes & 0x20) != 0) {
      UVar3 = (*(this->super_Collator).super_UObject._vptr_UObject[0x18])(this,5,errorCode);
      anon_unknown_16::appendAttribute(&local_178,'S',UVar3,errorCode);
    }
    iVar2 = uloc_getVariant_63(local_c8,local_138,100,errorCode);
    anon_unknown_16::appendSubtag(&local_178,'V',local_138,iVar2,errorCode);
    iVar2 = uloc_getScript_63(local_c8,local_138,100,errorCode);
    anon_unknown_16::appendSubtag(&local_178,'Z',local_138,iVar2,errorCode);
    iVar2 = local_178.len;
    iVar4 = 0;
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      if (local_178.len <= capacity) {
        memcpy(buffer,local_178.buffer.ptr,(long)local_178.len);
      }
      iVar4 = u_terminateChars_63(buffer,capacity,iVar2,errorCode);
    }
    MaybeStackArray<char,_40>::~MaybeStackArray(&local_178.buffer);
  }
  return iVar4;
}

Assistant:

int32_t
RuleBasedCollator::internalGetShortDefinitionString(const char *locale,
                                                    char *buffer, int32_t capacity,
                                                    UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) { return 0; }
    if(buffer == NULL ? capacity != 0 : capacity < 0) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    if(locale == NULL) {
        locale = internalGetLocaleID(ULOC_VALID_LOCALE, errorCode);
    }

    char resultLocale[ULOC_FULLNAME_CAPACITY + 1];
    int32_t length = ucol_getFunctionalEquivalent(resultLocale, ULOC_FULLNAME_CAPACITY,
                                                  "collation", locale,
                                                  NULL, &errorCode);
    if(U_FAILURE(errorCode)) { return 0; }
    if(length == 0) {
        uprv_strcpy(resultLocale, "root");
    } else {
        resultLocale[length] = 0;
    }

    // Append items in alphabetic order of their short definition letters.
    CharString result;
    char subtag[ULOC_KEYWORD_AND_VALUES_CAPACITY];

    if(attributeHasBeenSetExplicitly(UCOL_ALTERNATE_HANDLING)) {
        appendAttribute(result, 'A', getAttribute(UCOL_ALTERNATE_HANDLING, errorCode), errorCode);
    }
    // ATTR_VARIABLE_TOP not supported because 'B' was broken.
    // See ICU tickets #10372 and #10386.
    if(attributeHasBeenSetExplicitly(UCOL_CASE_FIRST)) {
        appendAttribute(result, 'C', getAttribute(UCOL_CASE_FIRST, errorCode), errorCode);
    }
    if(attributeHasBeenSetExplicitly(UCOL_NUMERIC_COLLATION)) {
        appendAttribute(result, 'D', getAttribute(UCOL_NUMERIC_COLLATION, errorCode), errorCode);
    }
    if(attributeHasBeenSetExplicitly(UCOL_CASE_LEVEL)) {
        appendAttribute(result, 'E', getAttribute(UCOL_CASE_LEVEL, errorCode), errorCode);
    }
    if(attributeHasBeenSetExplicitly(UCOL_FRENCH_COLLATION)) {
        appendAttribute(result, 'F', getAttribute(UCOL_FRENCH_COLLATION, errorCode), errorCode);
    }
    // Note: UCOL_HIRAGANA_QUATERNARY_MODE is deprecated and never changes away from default.
    length = uloc_getKeywordValue(resultLocale, "collation", subtag, UPRV_LENGTHOF(subtag), &errorCode);
    appendSubtag(result, 'K', subtag, length, errorCode);
    length = uloc_getLanguage(resultLocale, subtag, UPRV_LENGTHOF(subtag), &errorCode);
    appendSubtag(result, 'L', subtag, length, errorCode);
    if(attributeHasBeenSetExplicitly(UCOL_NORMALIZATION_MODE)) {
        appendAttribute(result, 'N', getAttribute(UCOL_NORMALIZATION_MODE, errorCode), errorCode);
    }
    length = uloc_getCountry(resultLocale, subtag, UPRV_LENGTHOF(subtag), &errorCode);
    appendSubtag(result, 'R', subtag, length, errorCode);
    if(attributeHasBeenSetExplicitly(UCOL_STRENGTH)) {
        appendAttribute(result, 'S', getAttribute(UCOL_STRENGTH, errorCode), errorCode);
    }
    length = uloc_getVariant(resultLocale, subtag, UPRV_LENGTHOF(subtag), &errorCode);
    appendSubtag(result, 'V', subtag, length, errorCode);
    length = uloc_getScript(resultLocale, subtag, UPRV_LENGTHOF(subtag), &errorCode);
    appendSubtag(result, 'Z', subtag, length, errorCode);

    if(U_FAILURE(errorCode)) { return 0; }
    if(result.length() <= capacity) {
        uprv_memcpy(buffer, result.data(), result.length());
    }
    return u_terminateChars(buffer, capacity, result.length(), &errorCode);
}